

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

void flatbuffers::GenStruct
               (StructDef *struct_def,Table *table,int indent,int indent_step,string *_text)

{
  FieldDef *fd_00;
  EnumDef *this;
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  reference ppFVar4;
  int iVar5;
  FieldDef *fd;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_48;
  const_iterator it;
  StructDef *union_sd;
  int fieldout;
  string *text;
  string *_text_local;
  int indent_step_local;
  int indent_local;
  Table *table_local;
  StructDef *struct_def_local;
  
  std::__cxx11::string::operator+=((string *)_text,"{");
  pcVar3 = NewLine(indent_step);
  std::__cxx11::string::operator+=((string *)_text,pcVar3);
  union_sd._4_4_ = 0;
  it._M_current = (FieldDef **)0x0;
  local_48._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  while( true ) {
    fd = (FieldDef *)
         std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                   (&(struct_def->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_48,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&fd);
    if (!bVar1) break;
    ppFVar4 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_48);
    fd_00 = *ppFVar4;
    if (((struct_def->fixed & 1U) != 0) ||
       (bVar1 = Table::CheckField(table,(voffset_t)(fd_00->value).offset), bVar1)) {
      iVar5 = union_sd._4_4_ + 1;
      if (union_sd._4_4_ != 0) {
        std::__cxx11::string::operator+=((string *)_text,",");
        pcVar3 = NewLine(indent_step);
        std::__cxx11::string::operator+=((string *)_text,pcVar3);
      }
      std::__cxx11::string::append((ulong)_text,(char)indent + (char)indent_step);
      std::__cxx11::string::operator+=((string *)_text,(string *)fd_00);
      std::__cxx11::string::operator+=((string *)_text,": ");
      switch((fd_00->value).type.base_type) {
      case BASE_TYPE_NONE:
        GenField<unsigned_char>
                  (fd_00,table,(bool)(struct_def->fixed & 1),indent + indent_step,indent_step,_text)
        ;
        break;
      case BASE_TYPE_UTYPE:
        GenField<unsigned_char>
                  (fd_00,table,(bool)(struct_def->fixed & 1),indent + indent_step,indent_step,_text)
        ;
        break;
      case BASE_TYPE_BOOL:
        GenField<unsigned_char>
                  (fd_00,table,(bool)(struct_def->fixed & 1),indent + indent_step,indent_step,_text)
        ;
        break;
      case BASE_TYPE_CHAR:
        GenField<signed_char>
                  (fd_00,table,(bool)(struct_def->fixed & 1),indent + indent_step,indent_step,_text)
        ;
        break;
      case BASE_TYPE_UCHAR:
        GenField<unsigned_char>
                  (fd_00,table,(bool)(struct_def->fixed & 1),indent + indent_step,indent_step,_text)
        ;
        break;
      case BASE_TYPE_SHORT:
        GenField<short>(fd_00,table,(bool)(struct_def->fixed & 1),indent + indent_step,indent_step,
                        _text);
        break;
      case BASE_TYPE_USHORT:
        GenField<unsigned_short>
                  (fd_00,table,(bool)(struct_def->fixed & 1),indent + indent_step,indent_step,_text)
        ;
        break;
      case BASE_TYPE_INT:
        GenField<int>(fd_00,table,(bool)(struct_def->fixed & 1),indent + indent_step,indent_step,
                      _text);
        break;
      case BASE_TYPE_UINT:
        GenField<unsigned_int>
                  (fd_00,table,(bool)(struct_def->fixed & 1),indent + indent_step,indent_step,_text)
        ;
        break;
      case BASE_TYPE_LONG:
        GenField<long>(fd_00,table,(bool)(struct_def->fixed & 1),indent + indent_step,indent_step,
                       _text);
        break;
      case BASE_TYPE_ULONG:
        GenField<unsigned_long>
                  (fd_00,table,(bool)(struct_def->fixed & 1),indent + indent_step,indent_step,_text)
        ;
        break;
      case BASE_TYPE_FLOAT:
        GenField<float>(fd_00,table,(bool)(struct_def->fixed & 1),indent + indent_step,indent_step,
                        _text);
        break;
      case BASE_TYPE_DOUBLE:
        GenField<double>(fd_00,table,(bool)(struct_def->fixed & 1),indent + indent_step,indent_step,
                         _text);
        break;
      case BASE_TYPE_STRING:
      case BASE_TYPE_VECTOR:
      case BASE_TYPE_STRUCT:
      case BASE_TYPE_UNION:
        GenFieldOffset(fd_00,table,(bool)(struct_def->fixed & 1),indent + indent_step,indent_step,
                       (StructDef *)it._M_current,_text);
      }
      union_sd._4_4_ = iVar5;
      if ((fd_00->value).type.base_type == BASE_TYPE_UTYPE) {
        this = (fd_00->value).type.enum_def;
        bVar2 = Table::GetField<unsigned_char>(table,(voffset_t)(fd_00->value).offset,'\0');
        it._M_current = (FieldDef **)EnumDef::ReverseLookup(this,(uint)bVar2);
      }
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_48);
  }
  pcVar3 = NewLine(indent_step);
  std::__cxx11::string::operator+=((string *)_text,pcVar3);
  std::__cxx11::string::append((ulong)_text,(char)indent);
  std::__cxx11::string::operator+=((string *)_text,"}");
  return;
}

Assistant:

static void GenStruct(const StructDef &struct_def, const Table *table,
                      int indent, int indent_step, std::string *_text) {
  std::string &text = *_text;
  text += "{";
  text += NewLine(indent_step);
  int fieldout = 0;
  StructDef *union_sd = nullptr;
  for (auto it = struct_def.fields.vec.begin();
       it != struct_def.fields.vec.end();
       ++it) {
    FieldDef &fd = **it;
    if (struct_def.fixed || table->CheckField(fd.value.offset)) {
      // The field is present.
      if (fieldout++) {
        text += ",";
        text += NewLine(indent_step);
      }
      text.append(indent + indent_step, ' ');
      text += fd.name;
      text += ": ";
      switch (fd.value.type.base_type) {
         #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE) \
           case BASE_TYPE_ ## ENUM: \
              GenField<CTYPE>(fd, table, struct_def.fixed, \
                              indent + indent_step, indent_step, _text); \
              break;
          FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
        // Generate drop-thru case statements for all pointer types:
        #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE) \
          case BASE_TYPE_ ## ENUM:
          FLATBUFFERS_GEN_TYPES_POINTER(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
            GenFieldOffset(fd, table, struct_def.fixed, indent + indent_step,
                           indent_step, union_sd, _text);
            break;
      }
      if (fd.value.type.base_type == BASE_TYPE_UTYPE) {
        union_sd = fd.value.type.enum_def->ReverseLookup(
                                 table->GetField<uint8_t>(fd.value.offset, 0));
      }
    }
  }
  text += NewLine(indent_step);
  text.append(indent, ' ');
  text += "}";
}